

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall blc::network::Socket::setBlock(Socket *this,bool block)

{
  int iVar1;
  exception *this_00;
  int *piVar2;
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  this->_block = block;
  iVar1 = fcntl(this->_socket,4,(ulong)((uint)!block << 0xb | this->_mode));
  if (iVar1 != -1) {
    return;
  }
  this_00 = (exception *)__cxa_allocate_exception(0x78);
  piVar2 = __errno_location();
  __s = strerror(*piVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  error::exception::exception(this_00,&local_38);
  __cxa_throw(this_00,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

void blc::network::Socket::setBlock(bool block) {
	int ret;

	this->_block = block;
	#ifdef __linux__
		ret = fcntl(this->_socket, F_SETFL, this->_mode | (SOCK_NONBLOCK * (1 - this->_block)));
	#elif __WIN32
		u_long mode = !block;
		ret = ioctlsocket(this->_socket, FIONBIO, &mode);
	#else
		ret = fcntl(this->_socket, F_SETFL, this->_mode | (SOCK_NONBLOCK * (1 - this->_block)));
	#endif
	if (ret == -1)
		throw blc::error::exception(strerror(errno));
}